

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O1

string * __thiscall
kratos::InterfaceDefinition::port
          (string *__return_storage_ptr__,InterfaceDefinition *this,string *name,uint32_t width,
          uint32_t size,PortDirection dir)

{
  initializer_list<unsigned_int> __l;
  uint32_t local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  allocator_type local_31;
  
  __l._M_len = 1;
  __l._M_array = &local_54;
  local_54 = size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,__l,&local_31);
  port(__return_storage_ptr__,this,name,width,&local_50,dir,Data);
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InterfaceDefinition::port(const std::string& name, uint32_t width, uint32_t size,
                                      kratos::PortDirection dir) {
    return port(name, width, std::vector<uint32_t>{size}, dir);
}